

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateFunctionName(ExpressionTranslateContext *ctx,FunctionData *function)

{
  InplaceStr name_00;
  InplaceStr name_01;
  InplaceStr name_02;
  InplaceStr name_03;
  InplaceStr name_04;
  InplaceStr name_05;
  undefined1 auVar1 [8];
  bool bVar2;
  uint uVar3;
  uint uVar4;
  long local_110;
  MatchData *alias_2;
  long local_e8;
  MatchData *alias_1;
  long local_c0;
  MatchData *alias;
  undefined1 local_78 [8];
  InplaceStr operatorName_1;
  InplaceStr namePart;
  undefined1 local_48 [8];
  InplaceStr operatorName;
  char *local_30;
  undefined1 local_28 [8];
  InplaceStr name;
  FunctionData *function_local;
  ExpressionTranslateContext *ctx_local;
  
  local_28 = (undefined1  [8])(function->name->name).begin;
  name.begin = (function->name->name).end;
  name.end = (char *)function;
  if (function->implementation != (FunctionData *)0x0) {
    name.end = (char *)function->implementation;
  }
  if (*(char *)local_28 == '$') {
    Print(ctx,"__");
    InplaceStr::InplaceStr((InplaceStr *)&operatorName.end,(char *)((long)local_28 + 1),name.begin);
    local_28 = (undefined1  [8])operatorName.end;
    name.begin = local_30;
  }
  name_05.end = name.begin;
  name_05.begin = (char *)local_28;
  _local_48 = GetOperatorName(name_05);
  bVar2 = InplaceStr::empty((InplaceStr *)local_48);
  if (!bVar2) {
    local_28 = local_48;
    name.begin = operatorName.begin;
  }
  if (*(long *)(*(long *)(name.end + 0x18) + 0x20) == 0) {
    if (((*(ScopeData **)(name.end + 0x18) == ctx->ctx->globalScope) ||
        (*(long *)(*(long *)(name.end + 0x18) + 0x10) != 0)) && ((name.end[0x11] & 1U) == 0)) {
      name_01.end = name.begin;
      name_01.begin = (char *)local_28;
      PrintEscapedName(ctx,name_01);
      for (local_e8 = *(long *)(name.end + 0x48); local_e8 != 0;
          local_e8 = *(long *)(local_e8 + 0x10)) {
        Print(ctx,"_");
        PrintEscapedTypeName(ctx,*(TypeBase **)(local_e8 + 8));
        Print(ctx,"_");
      }
      Print(ctx,"_");
      PrintEscapedName(ctx,*(InplaceStr *)(*(long *)(name.end + 0x28) + 0x10));
    }
    else {
      name_00.end = name.begin;
      name_00.begin = (char *)local_28;
      PrintEscapedName(ctx,name_00);
      for (local_110 = *(long *)(name.end + 0x48); local_110 != 0;
          local_110 = *(long *)(local_110 + 0x10)) {
        Print(ctx,"_");
        PrintEscapedTypeName(ctx,*(TypeBase **)(local_110 + 8));
        Print(ctx,"_");
      }
      Print(ctx,"_%d",(ulong)*(uint *)(name.end + 0x44));
    }
  }
  else {
    uVar3 = InplaceStr::length((InplaceStr *)local_28);
    uVar4 = InplaceStr::length((InplaceStr *)(*(long *)(*(long *)(name.end + 0x18) + 0x20) + 0x10));
    auVar1 = local_28;
    if (uVar4 + 2 < uVar3) {
      uVar3 = InplaceStr::length((InplaceStr *)(*(long *)(*(long *)(name.end + 0x18) + 0x20) + 0x10)
                                );
      InplaceStr::InplaceStr
                ((InplaceStr *)&operatorName_1.end,(char *)((long)auVar1 + (ulong)uVar3 + 2),
                 name.begin);
      name_04.end = namePart.begin;
      name_04.begin = operatorName_1.end;
      _local_78 = GetOperatorName(name_04);
      bVar2 = InplaceStr::empty((InplaceStr *)local_78);
      if (bVar2) {
        PrintEscapedTypeName(ctx,*(TypeBase **)(*(long *)(name.end + 0x18) + 0x20));
        Print(ctx,"__");
        name_03.end = namePart.begin;
        name_03.begin = operatorName_1.end;
        PrintEscapedName(ctx,name_03);
      }
      else {
        PrintEscapedTypeName(ctx,*(TypeBase **)(*(long *)(name.end + 0x18) + 0x20));
        Print(ctx,"__");
        PrintEscapedName(ctx,_local_78);
      }
    }
    else {
      name_02.end = name.begin;
      name_02.begin = (char *)local_28;
      PrintEscapedName(ctx,name_02);
    }
    for (local_c0 = *(long *)(name.end + 0x48); local_c0 != 0; local_c0 = *(long *)(local_c0 + 0x10)
        ) {
      Print(ctx,"_");
      PrintEscapedTypeName(ctx,*(TypeBase **)(local_c0 + 8));
      Print(ctx,"_");
    }
    Print(ctx,"_");
    PrintEscapedName(ctx,*(InplaceStr *)(*(long *)(name.end + 0x28) + 0x10));
  }
  bVar2 = InplaceStr::empty((InplaceStr *)local_28);
  if ((!bVar2) && (name.begin[-1] == '$')) {
    Print(ctx,"_");
  }
  return;
}

Assistant:

void TranslateFunctionName(ExpressionTranslateContext &ctx, FunctionData *function)
{
	InplaceStr name = function->name->name;

	if(function->implementation)
		function = function->implementation;

	if(*name.begin == '$')
	{
		Print(ctx, "__");

		name = InplaceStr(name.begin + 1, name.end);
	}

	InplaceStr operatorName = GetOperatorName(name);

	if(!operatorName.empty())
		name = operatorName;

	if(function->scope->ownerType)
	{
		if(name.length() > function->scope->ownerType->name.length() + 2)
		{
			InplaceStr namePart = InplaceStr(name.begin + function->scope->ownerType->name.length() + 2, name.end);
			InplaceStr operatorName = GetOperatorName(namePart);

			if(!operatorName.empty())
			{
				PrintEscapedTypeName(ctx, function->scope->ownerType);
				Print(ctx, "__");
				PrintEscapedName(ctx, operatorName);
			}
			else
			{
				PrintEscapedTypeName(ctx, function->scope->ownerType);
				Print(ctx, "__");
				PrintEscapedName(ctx, namePart);
			}
		}
		else
		{
			PrintEscapedName(ctx, name);
		}

		for(MatchData *alias = function->generics.head; alias; alias = alias->next)
		{
			Print(ctx, "_");
			PrintEscapedTypeName(ctx, alias->type);
			Print(ctx, "_");
		}

		Print(ctx, "_");
		PrintEscapedName(ctx, function->type->name);
	}
	else if((function->scope == ctx.ctx.globalScope || function->scope->ownerNamespace) && !function->isHidden)
	{
		PrintEscapedName(ctx, name);

		for(MatchData *alias = function->generics.head; alias; alias = alias->next)
		{
			Print(ctx, "_");
			PrintEscapedTypeName(ctx, alias->type);
			Print(ctx, "_");
		}

		Print(ctx, "_");
		PrintEscapedName(ctx, function->type->name);
	}
	else
	{
		PrintEscapedName(ctx, name);

		for(MatchData *alias = function->generics.head; alias; alias = alias->next)
		{
			Print(ctx, "_");
			PrintEscapedTypeName(ctx, alias->type);
			Print(ctx, "_");
		}

		Print(ctx, "_%d", function->functionIndex);
	}

	if(!name.empty() && *(name.end - 1) == '$')
		Print(ctx, "_");
}